

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_serverwindow.h
# Opt level: O1

void __thiscall Ui_ServerWindow::setupUi(Ui_ServerWindow *this,QWidget *ServerWindow)

{
  QGridLayout *this_00;
  QLabel *pQVar1;
  QPlainTextEdit *this_01;
  QSpacerItem *pQVar2;
  QPushButton *this_02;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QArrayData *local_40 [2];
  long local_30;
  
  QObject::objectName();
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,8);
    }
  }
  if (local_30 == 0) {
    QVar7.m_data = (storage_type *)0xc;
    QVar7.m_size = (qsizetype)local_40;
    QString::fromUtf8(QVar7);
    QObject::setObjectName((QString *)ServerWindow);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,8);
      }
    }
  }
  local_40[0] = (QArrayData *)&DAT_12c00000190;
  QWidget::resize((QSize *)ServerWindow);
  this_00 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(this_00,ServerWindow);
  this->gridLayout = this_00;
  QVar3.m_data = (storage_type *)0xa;
  QVar3.m_size = (qsizetype)local_40;
  QString::fromUtf8(QVar3);
  QObject::setObjectName((QString *)this_00);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,8);
    }
  }
  pQVar1 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar1,ServerWindow,0);
  this->label = pQVar1;
  QVar4.m_data = (storage_type *)0x5;
  QVar4.m_size = (qsizetype)local_40;
  QString::fromUtf8(QVar4);
  QObject::setObjectName((QString *)pQVar1);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,8);
    }
  }
  QGridLayout::addWidget(this->gridLayout,this->label,0,0,1,2,0);
  this_01 = (QPlainTextEdit *)operator_new(0x28);
  QPlainTextEdit::QPlainTextEdit(this_01,ServerWindow);
  this->logEditor = this_01;
  QVar5.m_data = (storage_type *)0x9;
  QVar5.m_size = (qsizetype)local_40;
  QString::fromUtf8(QVar5);
  QObject::setObjectName((QString *)this_01);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,8);
    }
  }
  QPlainTextEdit::setReadOnly(SUB81(this->logEditor,0));
  QGridLayout::addWidget(this->gridLayout,this->logEditor,1,0,1,2,0);
  pQVar2 = (QSpacerItem *)operator_new(0x28);
  *(undefined4 *)(pQVar2 + 8) = 0;
  *(code **)pQVar2 = QObject::objectName;
  *(undefined4 *)(pQVar2 + 0xc) = 0x12a;
  *(undefined4 *)(pQVar2 + 0x10) = 0x14;
  *(undefined4 *)(pQVar2 + 0x14) = 0x170000;
  *(undefined4 *)(pQVar2 + 0x18) = 0;
  *(undefined8 *)(pQVar2 + 0x1c) = 0xffffffff00000000;
  *(undefined4 *)(pQVar2 + 0x24) = 0xffffffff;
  this->horizontalSpacer = pQVar2;
  QGridLayout::addItem(this->gridLayout,pQVar2,2,0,1,1,0);
  this_02 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(this_02,ServerWindow);
  this->startStopButton = this_02;
  QVar6.m_data = (storage_type *)0xf;
  QVar6.m_size = (qsizetype)local_40;
  QString::fromUtf8(QVar6);
  QObject::setObjectName((QString *)this_02);
  if (local_40[0] != (QArrayData *)0x0) {
    LOCK();
    (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40[0],2,8);
    }
  }
  QGridLayout::addWidget(this->gridLayout,this->startStopButton,2,1,1,1,0);
  retranslateUi(this,ServerWindow);
  QMetaObject::connectSlotsByName((QObject *)ServerWindow);
  return;
}

Assistant:

void setupUi(QWidget *ServerWindow)
    {
        if (ServerWindow->objectName().isEmpty())
            ServerWindow->setObjectName(QString::fromUtf8("ServerWindow"));
        ServerWindow->resize(400, 300);
        gridLayout = new QGridLayout(ServerWindow);
        gridLayout->setObjectName(QString::fromUtf8("gridLayout"));
        label = new QLabel(ServerWindow);
        label->setObjectName(QString::fromUtf8("label"));

        gridLayout->addWidget(label, 0, 0, 1, 2);

        logEditor = new QPlainTextEdit(ServerWindow);
        logEditor->setObjectName(QString::fromUtf8("logEditor"));
        logEditor->setReadOnly(true);

        gridLayout->addWidget(logEditor, 1, 0, 1, 2);

        horizontalSpacer = new QSpacerItem(298, 20, QSizePolicy::Expanding, QSizePolicy::Minimum);

        gridLayout->addItem(horizontalSpacer, 2, 0, 1, 1);

        startStopButton = new QPushButton(ServerWindow);
        startStopButton->setObjectName(QString::fromUtf8("startStopButton"));

        gridLayout->addWidget(startStopButton, 2, 1, 1, 1);


        retranslateUi(ServerWindow);

        QMetaObject::connectSlotsByName(ServerWindow);
    }